

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void * anon_unknown.dwarf_136dd::do_malloc_pages(ThreadCache *heap,size_t size)

{
  Span *pSVar1;
  void *pvVar2;
  
  pSVar1 = tcmalloc::PageHeap::New
                     ((PageHeap *)tcmalloc::Static::pageheap_,
                      (((ulong)heap >> 0xd) + 1) - (ulong)(((ulong)heap & 0x1fff) == 0));
  if (pSVar1 == (Span *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)(pSVar1->start << 0xd);
  }
  return pvVar2;
}

Assistant:

static void* do_malloc_pages(ThreadCache* heap, size_t size) {
  void* result;

  Length num_pages = tcmalloc::pages(size);

  // NOTE: we're passing original size here as opposed to rounded-up
  // size as we do in do_malloc_small. The difference is small here
  // (at most 4k out of at least 256k). And not rounding up saves us
  // from possibility of overflow, which rounding up could produce.
  //
  // See https://github.com/gperftools/gperftools/issues/723
  if (heap->SampleAllocation(size)) {
    result = DoSampledAllocation(size);
  } else {
    Span* span = Static::pageheap()->New(num_pages);
    result = (PREDICT_FALSE(span == nullptr) ? nullptr : SpanToMallocResult(span));
  }

  if (should_report_large(num_pages)) {
    ReportLargeAlloc(num_pages, result);
  }
  return result;
}